

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

cl_int clEnqueueMigrateMemINTEL
                 (cl_command_queue queue,void *ptr,size_t size,cl_mem_migration_flags flags,
                 cl_uint num_events_in_wait_list,cl_event *event_wait_list,cl_event *event)

{
  _Rb_tree_header *p_Var1;
  CTracker *pCVar2;
  bool bVar3;
  _func_cl_int_cl_command_queue_void_ptr_size_t_cl_mem_migration_flags_cl_uint_cl_event_ptr_cl_event_ptr
  *p_Var4;
  CLIntercept *this;
  uint errorCode;
  int iVar5;
  cl_int errorCode_00;
  mapped_type *pmVar6;
  uint64_t enqueueCounter;
  time_point tVar7;
  time_point tVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  bool bVar11;
  cl_platform_id platform;
  cl_device_id device;
  cl_event local_event;
  cl_event *local_d8;
  undefined1 local_c0 [32];
  time_point local_a0;
  undefined1 local_98 [32];
  time_point local_78;
  undefined8 local_70;
  void *local_68;
  size_t local_60;
  string local_58;
  cl_event local_38;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x24;
  }
  local_98._0_8_ = (cl_device_id)0x0;
  local_68 = ptr;
  local_60 = size;
  (*(g_pIntercept->m_Dispatch).clGetCommandQueueInfo)(queue,0x1091,8,local_98,(size_t *)0x0);
  local_c0._0_8_ = (key_type)0x0;
  (*(this->m_Dispatch).clGetDeviceInfo)
            ((cl_device_id)local_98._0_8_,0x1031,8,local_c0,(size_t *)0x0);
  p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
  p_Var10 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var9 = &p_Var1->_M_header;
  for (; p_Var10 != (_Base_ptr)0x0;
      p_Var10 = (&p_Var10->_M_left)[*(key_type *)(p_Var10 + 1) < (ulong)local_c0._0_8_]) {
    if (*(key_type *)(p_Var10 + 1) >= (ulong)local_c0._0_8_) {
      p_Var9 = p_Var10;
    }
  }
  p_Var10 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
     (p_Var10 = p_Var9, (ulong)local_c0._0_8_ < *(key_type *)(p_Var9 + 1))) {
    p_Var10 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var10 == p_Var1) {
    local_c0._0_8_ = (key_type)0x0;
    pmVar6 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)local_c0);
  }
  else {
    pmVar6 = (mapped_type *)&p_Var10[1]._M_parent;
  }
  p_Var4 = pmVar6->clEnqueueMigrateMemINTEL;
  local_d8 = (cl_event *)flags;
  if (p_Var4 == (_func_cl_int_cl_command_queue_void_ptr_size_t_cl_mem_migration_flags_cl_uint_cl_event_ptr_cl_event_ptr
                 *)0x0) goto LAB_0013e4fb;
  enqueueCounter = CLIntercept::incrementEnqueueCounter(this);
  if (((((this->m_Config).AubCapture == true) &&
       ((this->m_Config).AubCaptureMinEnqueue <= enqueueCounter)) &&
      (enqueueCounter <= (this->m_Config).AubCaptureMaxEnqueue)) &&
     ((this->m_Config).AubCaptureIndividualEnqueues == false)) {
    CLIntercept::startAubCapture
              (this,"clEnqueueMigrateMemINTEL",enqueueCounter,(cl_kernel)0x0,0,(size_t *)0x0,
               (size_t *)0x0,queue);
  }
  local_d8 = (cl_event *)0x0;
  if ((this->m_Config).NullEnqueue == false) {
    getFormattedEventWaitList_abi_cxx11_
              ((string *)local_c0,this,num_events_in_wait_list,event_wait_list);
    if ((this->m_Config).CallLogging == true) {
      CEnumNameMap::name_mem_migration_flags_abi_cxx11_
                ((string *)local_98,&this->m_EnumNameMap,flags);
      CLIntercept::callLoggingEnter
                (this,"clEnqueueMigrateMemINTEL",enqueueCounter,(cl_kernel)0x0,
                 "queue = %p, ptr = %p, size = %zu, flags = %s (%llX)%s",queue,local_68,local_60,
                 local_98._0_8_,flags,local_c0._0_8_);
      if ((cl_device_id)local_98._0_8_ != (cl_device_id)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_);
      }
    }
    local_d8 = event;
    if ((this->m_Config).EventChecking == true) {
      CLIntercept::checkEventList
                (this,"clEnqueueMigrateMemINTEL",num_events_in_wait_list,event_wait_list,event);
    }
    local_38 = (cl_event)0x0;
    if ((((this->m_Config).DevicePerformanceTiming == false) &&
        ((this->m_Config).ITTPerformanceTiming == false)) &&
       (((this->m_Config).ChromePerformanceTiming == false &&
        ((this->m_Config).DevicePerfCounterEventBasedSampling != true)))) {
      local_78.__d.__r = (duration)0;
      local_70 = 0;
    }
    else {
      local_78.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_70 = CONCAT71((int7)((ulong)local_78.__d.__r >> 8),event == (cl_event *)0x0);
      local_d8 = event;
      if (event == (cl_event *)0x0) {
        local_d8 = &local_38;
      }
    }
    if (((this->m_Config).HostPerformanceTiming == false) &&
       ((this->m_Config).ChromeCallLogging != true)) {
      local_a0.__d.__r = (duration)0;
    }
    else {
      local_a0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    errorCode = (*pmVar6->clEnqueueMigrateMemINTEL)
                          (queue,local_68,local_60,flags,num_events_in_wait_list,event_wait_list,
                           local_d8);
    if (((this->m_Config).HostPerformanceTiming == false) &&
       ((this->m_Config).ChromeCallLogging != true)) {
      tVar7.__d.__r = (duration)0;
    }
    else {
      tVar7.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        local_98._0_8_ = (cl_device_id)(local_98 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"");
        CLIntercept::updateHostTimingStats
                  (this,"clEnqueueMigrateMemINTEL",(string *)local_98,local_a0,tVar7);
        if ((cl_device_id)local_98._0_8_ != (cl_device_id)(local_98 + 0x10)) {
          operator_delete((void *)local_98._0_8_);
        }
      }
    }
    if ((((this->m_Config).DevicePerformanceTiming == false) &&
        ((this->m_Config).ITTPerformanceTiming == false)) &&
       ((this->m_Config).ChromePerformanceTiming == false)) {
      if ((local_d8 != (cl_event *)0x0) &&
         ((this->m_Config).DevicePerfCounterEventBasedSampling != false)) {
LAB_0013dfac:
        bVar3 = false;
        if (enqueueCounter < (this->m_Config).DevicePerformanceTimingMinEnqueue) {
          bVar11 = false;
        }
        else {
          bVar11 = false;
          if (enqueueCounter <= (this->m_Config).DevicePerformanceTimingMaxEnqueue) {
            if ((this->m_Config).DevicePerformanceTimingSkipUnmap == true) {
              local_98._0_8_ = local_98 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_98,"clEnqueueMigrateMemINTEL","");
              iVar5 = std::__cxx11::string::compare(local_98);
              bVar11 = iVar5 != 0;
              bVar3 = true;
            }
            else {
              bVar11 = true;
              bVar3 = false;
            }
          }
        }
        if ((bVar3) && ((cl_device_id)local_98._0_8_ != (cl_device_id)(local_98 + 0x10))) {
          operator_delete((void *)local_98._0_8_);
        }
        if (bVar11) {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
          CLIntercept::addTimingEvent
                    (this,"clEnqueueMigrateMemINTEL",enqueueCounter,local_78,&local_58,queue,
                     *local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
        }
        if ((char)local_70 != '\0') {
          (*(this->m_Dispatch).clReleaseEvent)(*local_d8);
          goto LAB_0013e0c0;
        }
      }
    }
    else {
      if (local_d8 != (cl_event *)0x0) goto LAB_0013dfac;
LAB_0013e0c0:
      local_d8 = (cl_event *)0x0;
    }
    bVar3 = (this->m_Config).ErrorLogging;
    if ((bVar3 == false) && ((this->m_Config).ErrorAssert == false)) {
      if ((errorCode != 0) && ((this->m_Config).NoErrors != false)) {
LAB_0013e0f5:
        if (bVar3 != false) {
          CLIntercept::logError(this,"clEnqueueMigrateMemINTEL",errorCode);
        }
        if ((this->m_Config).ErrorAssert == true) {
          raise(5);
        }
        if ((this->m_Config).NoErrors != false) {
          errorCode = 0;
        }
      }
    }
    else {
      if (errorCode != 0) goto LAB_0013e0f5;
      errorCode = 0;
    }
    if (((local_d8 != (cl_event *)0x0) && ((this->m_Config).LeakChecking != false)) &&
       (*local_d8 != (cl_event)0x0)) {
      LOCK();
      pCVar2 = &(this->m_ObjectTracker).m_Events;
      (pCVar2->NumAllocations).super___atomic_base<unsigned_long>._M_i =
           (pCVar2->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
    }
    if ((this->m_Config).CallLogging == true) {
      CLIntercept::callLoggingExit
                (this,"clEnqueueMigrateMemINTEL",errorCode,local_d8,(cl_sync_point_khr *)0x0);
    }
    if ((this->m_Config).ChromeCallLogging == true) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
      CLIntercept::chromeCallLoggingExit
                (this,"clEnqueueMigrateMemINTEL",&local_58,true,enqueueCounter,local_a0,tVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
    }
    if (((local_d8 != (cl_event *)0x0) && (*local_d8 != (cl_event)0x0)) &&
       (((this->m_Config).ChromeCallLogging != false ||
        ((this->m_Config).ChromePerformanceTiming == true)))) {
      CLIntercept::addEvent(this,*local_d8,enqueueCounter);
    }
    local_d8 = (cl_event *)(ulong)errorCode;
    if ((key_type)local_c0._0_8_ != (key_type)(local_c0 + 0x10)) {
      operator_delete((void *)local_c0._0_8_);
    }
  }
  if ((this->m_Config).FinishAfterEnqueue == true) {
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar7.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar7.__d.__r = (duration)0;
    }
    CLIntercept::logFlushOrFinishAfterEnqueueStart(this,"clFinish","clEnqueueMigrateMemINTEL");
    errorCode_00 = (*(this->m_Dispatch).clFinish)(queue);
    CLIntercept::logFlushOrFinishAfterEnqueueEnd
              (this,"clFinish","clEnqueueMigrateMemINTEL",errorCode_00);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        local_c0._0_8_ = (key_type)(local_c0 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"");
        CLIntercept::updateHostTimingStats
                  (this,"(finish after enqueue)",(string *)local_c0,tVar7,tVar8);
        if ((key_type)local_c0._0_8_ != (key_type)(local_c0 + 0x10)) {
          operator_delete((void *)local_c0._0_8_);
        }
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        local_c0._0_8_ = (key_type)(local_c0 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"");
        CLIntercept::chromeCallLoggingExit
                  (this,"(finish after enqueue)",(string *)local_c0,false,0,tVar7,tVar8);
        if ((key_type)local_c0._0_8_ != (key_type)(local_c0 + 0x10)) {
          operator_delete((void *)local_c0._0_8_);
        }
      }
    }
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar7.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar7.__d.__r = (duration)0;
    }
    CLIntercept::checkTimingEvents(this);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        local_c0._0_8_ = (key_type)(local_c0 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"");
        CLIntercept::updateHostTimingStats
                  (this,"(device timing overhead)",(string *)local_c0,tVar7,tVar8);
        if ((key_type)local_c0._0_8_ != (key_type)(local_c0 + 0x10)) {
          operator_delete((void *)local_c0._0_8_);
        }
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        local_c0._0_8_ = (key_type)(local_c0 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"");
        CLIntercept::chromeCallLoggingExit
                  (this,"(device timing overhead)",(string *)local_c0,false,0,tVar7,tVar8);
        if ((key_type)local_c0._0_8_ != (key_type)(local_c0 + 0x10)) {
          operator_delete((void *)local_c0._0_8_);
        }
      }
    }
  }
  else if ((this->m_Config).FlushAfterEnqueue == true) {
    (*(this->m_Dispatch).clFlush)(queue);
  }
  if (((this->m_Config).AubCapture == true) &&
     ((((this->m_Config).AubCaptureIndividualEnqueues != false ||
       (enqueueCounter < (this->m_Config).AubCaptureMinEnqueue)) ||
      ((this->m_Config).AubCaptureMaxEnqueue < enqueueCounter)))) {
    CLIntercept::stopAubCapture(this,queue);
  }
LAB_0013e4fb:
  if (p_Var4 == (_func_cl_int_cl_command_queue_void_ptr_size_t_cl_mem_migration_flags_cl_uint_cl_event_ptr_cl_event_ptr
                 *)0x0) {
    return -0x24;
  }
  return (cl_int)local_d8;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clEnqueueMigrateMemINTEL(
    cl_command_queue queue,
    const void* ptr,
    size_t size,
    cl_mem_migration_flags flags,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(queue);
        if( dispatchX.clEnqueueMigrateMemINTEL )
        {
            cl_int  retVal = CL_SUCCESS;

            INCREMENT_ENQUEUE_COUNTER();
            CHECK_AUBCAPTURE_START( queue );

            if( pIntercept->config().NullEnqueue == false )
            {
                const std::string eventWaitListString = getFormattedEventWaitList(
                    pIntercept,
                    num_events_in_wait_list,
                    event_wait_list);

                CALL_LOGGING_ENTER( "queue = %p, ptr = %p, size = %zu, flags = %s (%llX)%s",
                    queue,
                    ptr,
                    size,
                    pIntercept->enumName().name_mem_migration_flags( flags ).c_str(),
                    flags,
                    eventWaitListString.c_str() );
                CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
                DEVICE_PERFORMANCE_TIMING_START( event );
                HOST_PERFORMANCE_TIMING_START();

                retVal = dispatchX.clEnqueueMigrateMemINTEL(
                    queue,
                    ptr,
                    size,
                    flags,
                    num_events_in_wait_list,
                    event_wait_list,
                    event );

                HOST_PERFORMANCE_TIMING_END();
                DEVICE_PERFORMANCE_TIMING_END( queue, event );
                CHECK_ERROR( retVal );
                ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
                CALL_LOGGING_EXIT_EVENT( retVal, event );
                ADD_EVENT( event ? event[0] : NULL );
            }

            FINISH_OR_FLUSH_AFTER_ENQUEUE( queue );
            CHECK_AUBCAPTURE_STOP( queue );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}